

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O1

void __thiscall
helics::CommonCore::sendErrorToFederates(CommonCore *this,int errorCode,string_view message)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  size_t size;
  long lVar4;
  FedInfo **ppFVar5;
  FedInfo *pFVar6;
  FedInfo **ppFVar7;
  FedInfo **ppFVar8;
  ulong uVar9;
  ActionMessage errorCom;
  ActionMessage AStack_e8;
  
  size = message._M_len;
  ActionMessage::ActionMessage(&AStack_e8,cmd_local_error);
  AStack_e8.source_id.gid = (this->super_BrokerBase).global_broker_id_local.gid;
  AStack_e8.messageID = errorCode;
  AStack_e8.payload.bufferSize = size;
  if ((AStack_e8.payload.heap != (byte *)message._M_str) &&
     (SmallBuffer::reserve(&AStack_e8.payload,size), size != 0)) {
    memcpy(AStack_e8.payload.heap,message._M_str,size);
  }
  if ((this->loopFederates).dataStorage.csize == 0) {
    uVar9 = (ulong)(this->loopFederates).dataStorage.bsize;
    ppFVar8 = (this->loopFederates).dataStorage.dataptr;
    if (uVar9 != 0x20) {
      ppFVar8 = ppFVar8 + (this->loopFederates).dataStorage.dataSlotIndex;
      pFVar6 = *ppFVar8 + uVar9;
      goto LAB_0031725f;
    }
    if (ppFVar8 == (FedInfo **)0x0) {
      ppFVar8 = &gmlc::containers::
                 StableBlockVector<helics::FedInfo,_5U,_std::allocator<helics::FedInfo>_>::end::
                 emptyValue;
    }
    else {
      ppFVar8 = ppFVar8 + (long)(this->loopFederates).dataStorage.dataSlotIndex + 1;
    }
  }
  else {
    ppFVar8 = (this->loopFederates).dataStorage.dataptr;
  }
  pFVar6 = *ppFVar8;
  uVar9 = 0;
LAB_0031725f:
  uVar3 = (this->loopFederates).dataStorage.bsize;
  ppFVar7 = (this->loopFederates).dataStorage.dataptr;
  lVar4 = (long)(this->loopFederates).dataStorage.dataSlotIndex;
  if (ppFVar7 == (FedInfo **)0x0) {
    ppFVar5 = &gmlc::containers::
               StableBlockVector<helics::FedInfo,_5U,_std::allocator<helics::FedInfo>_>::end::
               emptyValue;
  }
  else {
    ppFVar5 = ppFVar7 + lVar4 + 1;
  }
  uVar1 = 0;
  if (uVar3 != 0x20) {
    uVar1 = uVar3;
  }
  ppFVar7 = ppFVar7 + lVar4;
  if (uVar3 == 0x20) {
    ppFVar7 = ppFVar5;
  }
  uVar3 = (uint)uVar9;
  while ((iVar2 = (int)uVar9, uVar3 != uVar1 || (ppFVar8 != ppFVar7))) {
    if ((pFVar6->fed != (FederateState *)0x0) && (pFVar6->state == OPERATING)) {
      FederateState::addAction(pFVar6->fed,&AStack_e8);
    }
    uVar3 = iVar2 + 1;
    if (iVar2 < 0x1f) {
      pFVar6 = pFVar6 + 1;
    }
    else {
      ppFVar8 = ppFVar8 + (ulong)(iVar2 - 0x1fU >> 5) + 1;
      uVar3 = uVar3 & 0x1f;
      pFVar6 = (FedInfo *)((long)&(*ppFVar8)->fed + (ulong)(uVar3 << 4));
    }
    uVar9 = (ulong)uVar3;
  }
  ActionMessage::~ActionMessage(&AStack_e8);
  return;
}

Assistant:

void CommonCore::sendErrorToFederates(int errorCode, std::string_view message)
{
    ActionMessage errorCom(CMD_LOCAL_ERROR);
    errorCom.source_id = global_broker_id_local;
    errorCom.messageID = errorCode;
    errorCom.payload = message;
    loopFederates.apply([&errorCom](auto& fed) {
        if ((fed) && (fed.state == OperatingState::OPERATING)) {
            fed->addAction(errorCom);
        }
    });
}